

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ConstStringParam psVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  FileDescriptor *pFVar3;
  iterator iVar4;
  ostream *poVar5;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  ConstStringParam psVar6;
  CommandLineInterface *pCVar7;
  bool bVar8;
  allocator local_a9;
  FileDescriptor *parsed_file;
  CommandLineInterface *local_a0;
  ConstStringParam local_98;
  ConstStringParam local_90;
  DescriptorPool *local_88;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_a0 = this;
  local_80 = parsed_files;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (this->input_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      DescriptorPool::AddUnusedImportTrackFile(descriptor_pool,psVar6,false);
    }
  }
  psVar6 = (local_a0->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (local_a0->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &local_a0->direct_dependencies_;
  psVar2 = &local_a0->direct_dependencies_;
  local_78 = &local_a0->direct_dependencies_violation_msg_;
  pCVar7 = local_a0;
  local_88 = descriptor_pool;
  while( true ) {
    if ((psVar6 == local_90) ||
       (local_98 = psVar6, parsed_file = DescriptorPool::FindFileByName(descriptor_pool,psVar6),
       psVar6 = local_98, parsed_file == (FileDescriptor *)0x0)) goto LAB_0027f21d;
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back(local_80,&parsed_file);
    if ((pCVar7->disallow_services_ == true) && (0 < *(int *)(parsed_file + 0x34))) break;
    if (pCVar7->direct_dependencies_explicitly_set_ == true) {
      bVar8 = false;
      for (index = 0; index < *(int *)(parsed_file + 0x20); index = index + 1) {
        pFVar3 = FileDescriptor::dependency(parsed_file,index);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this_00->_M_t,*(key_type **)pFVar3);
        if ((_Rb_tree_header *)iVar4._M_node == &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
          poVar5 = std::operator<<((ostream *)&std::cerr,*(string **)parsed_file);
          poVar5 = std::operator<<(poVar5,": ");
          std::__cxx11::string::string((string *)&local_70,"%s",&local_a9);
          pFVar3 = FileDescriptor::dependency(parsed_file,index);
          StringReplace(&local_50,local_78,&local_70,*(string **)pFVar3,true);
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          bVar8 = true;
        }
      }
      pCVar7 = local_a0;
      psVar6 = local_98;
      descriptor_pool = local_88;
      if (bVar8) goto LAB_0027f21d;
    }
    psVar6 = local_98 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,*(string **)parsed_file);
  poVar5 = std::operator<<(poVar5,": This file contains services, but --disallow_services was used."
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  psVar6 = local_98;
LAB_0027f21d:
  bVar8 = psVar6 == local_90;
  DescriptorPool::ClearUnusedImportTrackFiles(descriptor_pool);
  return bVar8;
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddUnusedImportTrackFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == NULL) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }


    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearUnusedImportTrackFiles();
  return result;
}